

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O1

void duckdb::TemplatedRadixScatter<unsigned_short>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  ushort uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  idx_t iVar6;
  undefined7 in_register_00000089;
  idx_t s;
  idx_t iVar7;
  ulong uVar8;
  long lVar9;
  
  pdVar2 = vdata->data;
  if ((int)CONCAT71(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)sel->sel_vector[iVar6];
        }
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar3[iVar7];
        }
        uVar1 = *(ushort *)(pdVar2 + iVar7 * 2 + offset * 2);
        *(ushort *)key_locations[iVar6] = uVar1 << 8 | uVar1 >> 8;
        if (desc) {
          lVar9 = 0;
          do {
            key_locations[iVar6][lVar9] = ~key_locations[iVar6][lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
        }
        key_locations[iVar6] = key_locations[iVar6] + 2;
        iVar6 = iVar6 + 1;
      } while (iVar6 != add_count);
    }
  }
  else if (add_count != 0) {
    iVar6 = 0;
    do {
      iVar7 = iVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)sel->sel_vector[iVar6];
      }
      psVar3 = vdata->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar3[iVar7];
      }
      uVar8 = iVar7 + offset;
      puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
        *key_locations[iVar6] = nulls_first;
        uVar1 = *(ushort *)(pdVar2 + uVar8 * 2);
        *(ushort *)(key_locations[iVar6] + 1) = uVar1 << 8 | uVar1 >> 8;
        if (desc) {
          lVar9 = 0;
          do {
            key_locations[iVar6][lVar9 + 1] = ~key_locations[iVar6][lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 2);
        }
      }
      else {
        *key_locations[iVar6] = !nulls_first;
        pdVar5 = key_locations[iVar6];
        pdVar5[1] = '\0';
        pdVar5[2] = '\0';
      }
      key_locations[iVar6] = key_locations[iVar6] + 3;
      iVar6 = iVar6 + 1;
    } while (iVar6 != add_count);
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}